

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.c
# Opt level: O0

int lmatcher(re_guts *g,char *string,size_t nmatch,regmatch_t *pmatch,int eflags)

{
  sopno stopst;
  int iVar1;
  long startst;
  size_t sVar2;
  regoff_t *prVar3;
  char *local_e8;
  char *stop;
  char *start;
  sopno gl;
  sopno gf;
  char *dp;
  lmat *m;
  lmat mv;
  char *pcStack_40;
  int i;
  char *endp;
  int eflags_local;
  regmatch_t *pmatch_local;
  size_t nmatch_local;
  char *string_local;
  re_guts *g_local;
  
  startst = g->firststate + 1;
  stopst = g->laststate;
  pmatch_local = (regmatch_t *)nmatch;
  if ((g->cflags & 4U) != 0) {
    pmatch_local = (regmatch_t *)0x0;
  }
  if ((eflags & 4U) == 0) {
    sVar2 = strlen(string);
    stop = string;
  }
  else {
    stop = string + pmatch->rm_so;
    sVar2 = pmatch->rm_eo;
  }
  local_e8 = string + sVar2;
  if (local_e8 < stop) {
    g_local._4_4_ = 0x10;
  }
  else {
    if (g->must != (char *)0x0) {
      gf = (sopno)stop;
      while (((ulong)gf < local_e8 &&
             (((*(char *)gf != *g->must || ((long)local_e8 - gf < (long)g->mlen)) ||
              (iVar1 = memcmp((void *)gf,g->must,(long)g->mlen), iVar1 != 0))))) {
        gf = gf + 1;
      }
      if ((char *)gf == local_e8) {
        return 1;
      }
    }
    mv.eflags = 0;
    mv._12_4_ = 0;
    mv.coldp = (char *)0x0;
    mv.offp = stop;
    mv.beginp = local_e8;
    m = (lmat *)g;
    mv.g._0_4_ = eflags;
    mv.pmatch = (regmatch_t *)string;
    mv._64_8_ = malloc(g->nstates << 2);
    if ((char *)mv._64_8_ != (char *)0x0) {
      mv.st = (char *)(mv._64_8_ + (long)m->coldp);
      mv.fresh = (char *)(mv._64_8_ + (long)m->coldp * 2);
      mv.lastpos._0_4_ = 4;
      mv.tmp = (char *)(mv._64_8_ + (long)m->coldp * 3);
      mv.space = (char *)mv._64_8_;
      memset(mv.tmp,0,(size_t)m->coldp);
      while( true ) {
        pcStack_40 = lfast((lmat *)&m,stop,local_e8,startst,stopst);
        if (pcStack_40 == (char *)0x0) {
          free((void *)mv._64_8_);
          return 1;
        }
        if ((pmatch_local == (regmatch_t *)0x0) && (g->backrefs == 0)) break;
        if (mv.endp == (char *)0x0) {
          __assert_fail("m->coldp != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                        ,0x9c,"int lmatcher()");
        }
        while( true ) {
          if (((uint)mv.g & 0x100) != 0) {
            printf("=%s\n","finding start");
          }
          pcStack_40 = lslow((lmat *)&m,mv.endp,local_e8,startst,stopst);
          if (pcStack_40 != (char *)0x0) break;
          if (mv.beginp <= mv.endp) {
            __assert_fail("m->coldp < m->endp",
                          "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                          ,0xa2,"int lmatcher()");
          }
          mv.endp = mv.endp + 1;
        }
        if ((pmatch_local == (regmatch_t *)0x1) && (g->backrefs == 0)) break;
        if (mv._8_8_ == 0) {
          mv._8_8_ = malloc((long)((long)&(m[1].g)->magic + 1) * 0x10);
        }
        if (mv._8_8_ == 0) {
          free((void *)mv._64_8_);
          return 0xc;
        }
        for (mv.empty._4_4_ = 1; (re_guts *)(long)mv.empty._4_4_ <= m[1].g;
            mv.empty._4_4_ = mv.empty._4_4_ + 1) {
          *(undefined8 *)(mv._8_8_ + (long)mv.empty._4_4_ * 0x10 + 8) = 0xffffffffffffffff;
          *(undefined8 *)(mv._8_8_ + (long)mv.empty._4_4_ * 0x10) = 0xffffffffffffffff;
        }
        if ((g->backrefs == 0) && (((uint)mv.g & 0x400) == 0)) {
          if (((uint)mv.g & 0x100) != 0) {
            printf("=%s\n","dissecting");
          }
          gf = (sopno)ldissect((lmat *)&m,mv.endp,pcStack_40,startst,stopst);
        }
        else {
          if ((0 < g->nplus) && (mv.coldp == (char *)0x0)) {
            mv.coldp = (char *)malloc((g->nplus + 1) * 8);
          }
          if ((0 < g->nplus) && (mv.coldp == (char *)0x0)) {
            free((void *)mv._8_8_);
            free((void *)mv._64_8_);
            return 0xc;
          }
          if (((uint)mv.g & 0x100) != 0) {
            printf("=%s\n","backref dissect");
          }
          gf = (sopno)lbackref((lmat *)&m,mv.endp,pcStack_40,startst,stopst,0);
        }
        if (gf != 0) break;
        if (g->backrefs == 0) {
          __assert_fail("g->backrefs",
                        "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                        ,0xc5,"int lmatcher()");
        }
        if ((g->nplus != 0) && (mv.coldp == (char *)0x0)) {
          __assert_fail("g->nplus == 0 || m->lastpos != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                        ,0xc6,"int lmatcher()");
        }
        while ((gf == 0 && (mv.endp < pcStack_40))) {
          if (((uint)mv.g & 0x100) != 0) {
            printf("=%s\n","backoff");
          }
          pcStack_40 = lslow((lmat *)&m,mv.endp,pcStack_40 + -1,startst,stopst);
          if (pcStack_40 == (char *)0x0) break;
          for (mv.empty._4_4_ = 1; (re_guts *)(long)mv.empty._4_4_ <= m[1].g;
              mv.empty._4_4_ = mv.empty._4_4_ + 1) {
            if (*(long *)(mv._8_8_ + (long)mv.empty._4_4_ * 0x10) != -1) {
              __assert_fail("m->pmatch[i].rm_so == -1",
                            "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                            ,0xd1,"int lmatcher()");
            }
            if (*(long *)(mv._8_8_ + (long)mv.empty._4_4_ * 0x10 + 8) != -1) {
              __assert_fail("m->pmatch[i].rm_eo == -1",
                            "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                            ,0xd2,"int lmatcher()");
            }
          }
          if (((uint)mv.g & 0x100) != 0) {
            printf("=%s\n","backoff dissect");
          }
          gf = (sopno)lbackref((lmat *)&m,mv.endp,pcStack_40,startst,stopst,0);
        }
        if ((gf != 0) && ((char *)gf != pcStack_40)) {
          __assert_fail("dp == NULL || dp == endp",
                        "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                        ,0xd8,"int lmatcher()");
        }
        if (gf != 0) break;
        if (((uint)mv.g & 0x100) != 0) {
          printf("=%s\n","false alarm");
        }
        stop = mv.endp + 1;
        if (local_e8 < stop) {
          __assert_fail("start <= stop",
                        "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                        ,0xdf,"int lmatcher()");
        }
      }
      if (pmatch_local != (regmatch_t *)0x0) {
        pmatch->rm_so = (long)mv.endp - (long)mv.pmatch;
        pmatch->rm_eo = (long)pcStack_40 - (long)mv.pmatch;
      }
      if ((regmatch_t *)0x1 < pmatch_local) {
        if (mv._8_8_ == 0) {
          __assert_fail("m->pmatch != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                        ,0xe8,"int lmatcher()");
        }
        for (mv.empty._4_4_ = 1; (regmatch_t *)(long)mv.empty._4_4_ < pmatch_local;
            mv.empty._4_4_ = mv.empty._4_4_ + 1) {
          if (m[1].g < (re_guts *)(long)mv.empty._4_4_) {
            pmatch[mv.empty._4_4_].rm_so = -1;
            pmatch[mv.empty._4_4_].rm_eo = -1;
          }
          else {
            prVar3 = (regoff_t *)(mv._8_8_ + (long)mv.empty._4_4_ * 0x10);
            pmatch[mv.empty._4_4_].rm_so = *prVar3;
            pmatch[mv.empty._4_4_].rm_eo = prVar3[1];
          }
        }
      }
      if (mv._8_8_ != 0) {
        free((void *)mv._8_8_);
      }
      if (mv.coldp != (char *)0x0) {
        free(mv.coldp);
      }
      free((void *)mv._64_8_);
      return 0;
    }
    g_local._4_4_ = 0xc;
  }
  return g_local._4_4_;
}

Assistant:

static int			/* 0 success, REG_NOMATCH failure */
matcher(g, string, nmatch, pmatch, eflags)
struct re_guts *g;
char *string;
size_t nmatch;
regmatch_t pmatch[];
int eflags;
{
	char *endp;
	int i;
	struct match mv;
	struct match *m = &mv;
	char *dp;
	const sopno gf = g->firststate+1;	/* +1 for OEND */
	const sopno gl = g->laststate;
	char *start;
	char *stop;

	/* simplify the situation where possible */
	if (g->cflags&REG_NOSUB)
		nmatch = 0;
	if (eflags&REG_STARTEND) {
		start = string + pmatch[0].rm_so;
		stop = string + pmatch[0].rm_eo;
	} else {
		start = string;
		stop = start + strlen(start);
	}
	if (stop < start)
		return(REG_INVARG);

	/* prescreening; this does wonders for this rather slow code */
	if (g->must != NULL) {
		for (dp = start; dp < stop; dp++)
			if (*dp == g->must[0] && stop - dp >= g->mlen &&
				memcmp(dp, g->must, (size_t)g->mlen) == 0)
				break;
		if (dp == stop)		/* we didn't find g->must */
			return(REG_NOMATCH);
	}

	/* match struct setup */
	m->g = g;
	m->eflags = eflags;
	m->pmatch = NULL;
	m->lastpos = NULL;
	m->offp = string;
	m->beginp = start;
	m->endp = stop;
	STATESETUP(m, 4);
	SETUP(m->st);
	SETUP(m->fresh);
	SETUP(m->tmp);
	SETUP(m->empty);
	CLEAR(m->empty);

	/* this loop does only one repetition except for backrefs */
	for (;;) {
		endp = fast(m, start, stop, gf, gl);
		if (endp == NULL) {		/* a miss */
			STATETEARDOWN(m);
			return(REG_NOMATCH);
		}
		if (nmatch == 0 && !g->backrefs)
			break;		/* no further info needed */

		/* where? */
		assert(m->coldp != NULL);
		for (;;) {
			NOTE("finding start");
			endp = slow(m, m->coldp, stop, gf, gl);
			if (endp != NULL)
				break;
			assert(m->coldp < m->endp);
			m->coldp++;
		}
		if (nmatch == 1 && !g->backrefs)
			break;		/* no further info needed */

		/* oh my, he wants the subexpressions... */
		if (m->pmatch == NULL)
			m->pmatch = (regmatch_t *)malloc((m->g->nsub + 1) *
							sizeof(regmatch_t));
		if (m->pmatch == NULL) {
			STATETEARDOWN(m);
			return(REG_ESPACE);
		}
		for (i = 1; (size_t) i <= m->g->nsub; i++)
			m->pmatch[i].rm_so = m->pmatch[i].rm_eo = -1;
		if (!g->backrefs && !(m->eflags&REG_BACKR)) {
			NOTE("dissecting");
			dp = dissect(m, m->coldp, endp, gf, gl);
		} else {
			if (g->nplus > 0 && m->lastpos == NULL)
				m->lastpos = (char **)malloc(((size_t)g->nplus+1) *
							sizeof(char *));
			if (g->nplus > 0 && m->lastpos == NULL) {
				free(m->pmatch);
				STATETEARDOWN(m);
				return(REG_ESPACE);
			}
			NOTE("backref dissect");
			dp = backref(m, m->coldp, endp, gf, gl, (sopno)0);
		}
		if (dp != NULL)
			break;

		/* uh-oh... we couldn't find a subexpression-level match */
		assert(g->backrefs);	/* must be back references doing it */
		assert(g->nplus == 0 || m->lastpos != NULL);
		for (;;) {
			if (dp != NULL || endp <= m->coldp)
				break;		/* defeat */
			NOTE("backoff");
			endp = slow(m, m->coldp, endp-1, gf, gl);
			if (endp == NULL)
				break;		/* defeat */
			/* try it on a shorter possibility */
#ifndef NDEBUG
			for (i = 1; (size_t) i <= m->g->nsub; i++) {
				assert(m->pmatch[i].rm_so == -1);
				assert(m->pmatch[i].rm_eo == -1);
			}
#endif
			NOTE("backoff dissect");
			dp = backref(m, m->coldp, endp, gf, gl, (sopno)0);
		}
		assert(dp == NULL || dp == endp);
		if (dp != NULL)		/* found a shorter one */
			break;

		/* despite initial appearances, there is no match here */
		NOTE("false alarm");
		start = m->coldp + 1;	/* recycle starting later */
		assert(start <= stop);
	}

	/* fill in the details if requested */
	if (nmatch > 0) {
		pmatch[0].rm_so = (regoff_t)(m->coldp - m->offp);
		pmatch[0].rm_eo = (regoff_t)(endp - m->offp);
	}
	if (nmatch > 1) {
		assert(m->pmatch != NULL);
		for (i = 1; (size_t) i < nmatch; i++)
			if ((size_t) i <= m->g->nsub)
				pmatch[i] = m->pmatch[i];
			else {
				pmatch[i].rm_so = -1;
				pmatch[i].rm_eo = -1;
			}
	}

	if (m->pmatch != NULL)
		free((char *)m->pmatch);
	if (m->lastpos != NULL)
		free((char *)m->lastpos);
	STATETEARDOWN(m);
	return(0);
}